

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
                  *this,node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
                        *container,MatchResultListener *listener)

{
  pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int> *value;
  pointer pMVar1;
  bool bVar2;
  pointer pcVar3;
  ctrl_t *pcVar4;
  long lVar5;
  size_t irhs;
  long lVar6;
  size_t num_elements;
  size_t sVar7;
  iterator iVar8;
  iterator local_268;
  ctrl_t *local_258;
  size_t local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  vector<char,_std::allocator<char>_> did_match;
  MatchMatrix matrix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  DummyMatchResultListener dummy;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  element_printouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  element_printouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  element_printouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = phmap::priv::
          raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
          ::begin((raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
                   *)container);
  local_258 = (container->
              super_raw_hash_map<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
              ).
              super_raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
              .ctrl_ + (container->
                       super_raw_hash_map<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
                       ).
                       super_raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
                       .capacity_;
  local_268 = iVar8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&element_printouts);
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dummy.super_MatchResultListener.stream_ = (ostream *)0x0;
  dummy.super_MatchResultListener._vptr_MatchResultListener =
       (_func_int **)&PTR__MatchResultListener_001db768;
  num_elements = 0;
  pcVar4 = iVar8.ctrl_;
  while (pcVar4 != local_258) {
    if (listener->stream_ != (ostream *)0x0) {
      value = *local_268.field_1.slot_;
      std::__cxx11::stringstream::stringstream(local_1b8);
      UniversalPrint<std::pair<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>>
                (value,local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &element_printouts,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    lVar5 = 0;
    local_250 = num_elements;
    for (lVar6 = 0;
        pMVar1 = (this->matchers_).
                 super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar6 != ((long)(this->matchers_).
                        super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) / 0x18;
        lVar6 = lVar6 + 1) {
      local_1b8[0] = (stringstream)
                     MatcherBase<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>
                     ::MatchAndExplain((MatcherBase<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>
                                        *)((long)&(pMVar1->
                                                  super_MatcherBase<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>
                                                  ).super_MatcherDescriberInterface.
                                                  _vptr_MatcherDescriberInterface + lVar5),
                                       *local_268.field_1.slot_,&dummy.super_MatchResultListener);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&did_match,(char *)local_1b8);
      lVar5 = lVar5 + 0x18;
    }
    num_elements = local_250 + 1;
    phmap::priv::
    raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
    ::iterator::operator++(&local_268);
    pcVar4 = local_268.ctrl_;
  }
  MatchMatrix::MatchMatrix
            (&matrix,num_elements,
             ((long)(this->matchers_).
                    super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->matchers_).
                   super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pcVar3 = did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  for (sVar7 = 0; sVar7 != num_elements; sVar7 = sVar7 + 1) {
    for (lVar5 = 0;
        lVar5 != ((long)(this->matchers_).
                        super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->matchers_).
                       super__Vector_base<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18; lVar5 = lVar5 + 1) {
      matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5 + matrix.num_matchers_ * sVar7] = pcVar3[lVar5] != '\0'
      ;
    }
    pcVar3 = pcVar3 + lVar5;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&did_match.super__Vector_base<char,_std::allocator<char>_>);
  bVar2 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,&element_printouts,&matrix,
                     listener);
  if (bVar2) {
    bVar2 = UnorderedElementsAreMatcherImplBase::FindPairing
                      (&this->super_UnorderedElementsAreMatcherImplBase,&matrix,listener);
  }
  else {
    bVar2 = false;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&element_printouts);
  return bVar2;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }